

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCommentComplex(xmlParserCtxtPtr ctxt,xmlChar *buf,size_t len,size_t size)

{
  xmlParserInputPtr pxVar1;
  commentSAXFunc p_Var2;
  uint val;
  uint uVar3;
  int iVar4;
  xmlChar *pxVar5;
  uint uVar6;
  char *msg;
  ulong uVar7;
  int l;
  int rl;
  int ql;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  ulong local_40;
  ulong local_38;
  
  iVar4 = ctxt->input->id;
  if (buf == (xmlChar *)0x0) {
    size = 100;
    buf = (xmlChar *)(*xmlMallocAtomic)(100);
    if (buf == (xmlChar *)0x0) {
      xmlErrMemory(ctxt,(char *)0x0);
      return;
    }
    len = 0;
  }
  local_44 = iVar4;
  if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  val = xmlCurrentChar(ctxt,&local_48);
  if (val == 0) {
LAB_0015fdd9:
    xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment not terminated\n",(xmlChar *)0x0);
  }
  else {
    if ((int)val < 0x100) {
      if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
      goto LAB_0015fa7a;
    }
    else if ((val - 0x10000 < 0x100000 || val - 0xe000 < 0x1ffe) || (int)val < 0xd800) {
LAB_0015fa7a:
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_48;
      uVar3 = xmlCurrentChar(ctxt,&local_4c);
      if (uVar3 == 0) goto LAB_0015fdd9;
      uVar7 = (ulong)uVar3;
      if ((int)uVar3 < 0x100) {
        if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
LAB_0015fad4:
          pxVar1 = ctxt->input;
          if (*pxVar1->cur == '\n') {
            pxVar1->line = pxVar1->line + 1;
            pxVar1->col = 1;
          }
          else {
            pxVar1->col = pxVar1->col + 1;
          }
          pxVar1->cur = pxVar1->cur + local_4c;
          uVar3 = xmlCurrentChar(ctxt,&local_50);
          if (uVar3 != 0) {
            local_40 = 0;
            while( true ) {
              uVar6 = (uint)uVar7;
              if ((int)uVar3 < 0x100) break;
              if ((0xfffff < uVar3 - 0x10000 && 0x1ffd < uVar3 - 0xe000) && 0xd7ff < (int)uVar3)
              goto LAB_0015fe0a;
LAB_0015fbe9:
              if (((val == 0x2d) && (uVar6 == 0x2d)) && (uVar3 == 0x3e)) goto LAB_0015fe0a;
              if (val == 0x2d && uVar6 == 0x2d) {
                xmlFatalErr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,(char *)0x0);
              }
              if ((10000000 < len) && ((ctxt->options & 0x80000) == 0)) {
                msg = "Comment too big found";
                pxVar5 = (xmlChar *)0x0;
                goto LAB_0015ff08;
              }
              uVar7 = (ulong)uVar3;
              pxVar5 = buf;
              if (size <= len + 5) {
                size = size * 2;
                local_38 = (ulong)uVar3;
                pxVar5 = (xmlChar *)(*xmlRealloc)(buf,size);
                uVar7 = local_38;
                if (pxVar5 == (xmlChar *)0x0) {
                  (*xmlFree)(buf);
                  xmlErrMemory(ctxt,(char *)0x0);
                  return;
                }
              }
              buf = pxVar5;
              if (local_48 == 1) {
                buf[len] = (xmlChar)val;
                len = len + 1;
              }
              else {
                iVar4 = xmlCopyCharMultiByte(buf + len,val);
                len = len + (long)iVar4;
              }
              local_48 = local_4c;
              local_4c = local_50;
              if (local_40 < 0x32) {
                local_40 = local_40 + 1;
              }
              else {
                if ((ctxt->progressive == 0) &&
                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                  xmlGROW(ctxt);
                }
                if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015fdf9;
                local_40 = 0;
              }
              pxVar1 = ctxt->input;
              if (*pxVar1->cur == '\n') {
                pxVar1->line = pxVar1->line + 1;
                pxVar1->col = 1;
              }
              else {
                pxVar1->col = pxVar1->col + 1;
              }
              pxVar1->cur = pxVar1->cur + local_50;
              uVar3 = xmlCurrentChar(ctxt,&local_50);
              val = uVar6;
              if (uVar3 == 0) {
                if (ctxt->progressive == 0) {
                  pxVar1 = ctxt->input;
                  if ((500 < (long)pxVar1->cur - (long)pxVar1->base) &&
                     ((long)pxVar1->end - (long)pxVar1->cur < 500)) {
                    xmlSHRINK(ctxt);
                  }
                }
                if ((ctxt->progressive == 0) &&
                   ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
                  xmlGROW(ctxt);
                }
                uVar3 = xmlCurrentChar(ctxt,&local_50);
              }
            }
            if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0))))
            goto LAB_0015fbe9;
LAB_0015fe0a:
            buf[len] = '\0';
            if (uVar3 == 0) {
              msg = "Comment not terminated \n<!--%.50s\n";
              pxVar5 = buf;
LAB_0015ff08:
              xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,msg,pxVar5);
            }
            else {
              if ((int)uVar3 < 0x100) {
                if (((int)uVar3 < 0x20) && ((0xd < uVar3 || ((0x2600U >> (uVar3 & 0x1f) & 1) == 0)))
                   ) {
LAB_0015fedf:
                  xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,
                                    "xmlParseComment: invalid xmlChar value %d\n",uVar3);
                  goto LAB_0015fdf9;
                }
              }
              else if ((0xfffff < uVar3 - 0x10000 && 0x1ffd < uVar3 - 0xe000) && 0xd7ff < (int)uVar3
                      ) goto LAB_0015fedf;
              if (local_44 != ctxt->input->id) {
                xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                               "Comment doesn\'t start and stop in the same entity\n");
              }
              xmlNextChar(ctxt);
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                  (p_Var2 = ctxt->sax->comment, p_Var2 != (commentSAXFunc)0x0)) &&
                 (ctxt->disableSAX == 0)) {
                (*p_Var2)(ctxt->userData,buf);
              }
            }
            goto LAB_0015fdf9;
          }
          goto LAB_0015fdd9;
        }
      }
      else if ((uVar3 - 0x10000 < 0x100000 || uVar3 - 0xe000 < 0x1ffe) || (int)uVar3 < 0xd800)
      goto LAB_0015fad4;
    }
    xmlFatalErrMsgInt(ctxt,XML_ERR_INVALID_CHAR,"xmlParseComment: invalid xmlChar value %d\n",val);
  }
LAB_0015fdf9:
  (*xmlFree)(buf);
  return;
}

Assistant:

static void
xmlParseCommentComplex(xmlParserCtxtPtr ctxt, xmlChar *buf,
                       size_t len, size_t size) {
    int q, ql;
    int r, rl;
    int cur, l;
    size_t count = 0;
    int inputid;

    DEBUG_ENTER(("xmlParseCommentComplex(%s, %s, %ld, %ld);\n", dbgCtxt(ctxt), dbgStr(buf), (long)len, (long)size));

    inputid = ctxt->input->id;

    if (buf == NULL) {
        len = 0;
	size = XML_PARSER_BUFFER_SIZE;
	buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	if (buf == NULL) {
	    xmlErrMemory(ctxt, NULL);
	    RETURN();
	}
    }
    GROW;	/* Assure there's enough input data */
    q = CUR_CHAR(ql);
    if (q == 0)
        goto not_terminated;
    if (!IS_CHAR(q)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	RETURN();
    }
    NEXTL(ql);
    r = CUR_CHAR(rl);
    if (r == 0)
        goto not_terminated;
    if (!IS_CHAR(r)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  q);
	xmlFree (buf);
	RETURN();
    }
    NEXTL(rl);
    cur = CUR_CHAR(l);
    if (cur == 0)
        goto not_terminated;
    while (IS_CHAR(cur) && /* checked */
           ((cur != '>') ||
	    (r != '-') || (q != '-'))) {
	if ((r == '-') && (q == '-')) {
	    xmlFatalErr(ctxt, XML_ERR_HYPHEN_IN_COMMENT, NULL);
	}
        if ((len > XML_MAX_TEXT_LENGTH) &&
            ((ctxt->options & XML_PARSE_HUGE) == 0)) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                         "Comment too big found", NULL);
            xmlFree (buf);
            RETURN();
        }
	if (len + 5 >= size) {
	    xmlChar *new_buf;
            size_t new_size;

	    new_size = size * 2;
	    new_buf = (xmlChar *) xmlRealloc(buf, new_size);
	    if (new_buf == NULL) {
		xmlFree (buf);
		xmlErrMemory(ctxt, NULL);
		RETURN();
	    }
	    buf = new_buf;
            size = new_size;
	}
	COPY_BUF(ql,buf,len,q);
	q = r;
	ql = rl;
	r = cur;
	rl = l;

	count++;
	if (count > 50) {
	    GROW;
	    count = 0;
            if (ctxt->instate == XML_PARSER_EOF) {
		xmlFree(buf);
		RETURN();
            }
	}
	NEXTL(l);
	cur = CUR_CHAR(l);
	if (cur == 0) {
	    SHRINK;
	    GROW;
	    cur = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    if (cur == 0) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
	                     "Comment not terminated \n<!--%.50s\n", buf);
    } else if (!IS_CHAR(cur)) {
        xmlFatalErrMsgInt(ctxt, XML_ERR_INVALID_CHAR,
                          "xmlParseComment: invalid xmlChar value %d\n",
	                  cur);
    } else {
	if (inputid != ctxt->input->id) {
	    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
		           "Comment doesn't start and stop in the same"
                           " entity\n");
	}
        NEXT;
	if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
	    (!ctxt->disableSAX))
	    ctxt->sax->comment(ctxt->userData, buf);
    }
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseComment. ctxt = %s;\n", dbgCtxt(ctxt)));
not_terminated:
    xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
			 "Comment not terminated\n", NULL);
    xmlFree(buf);
    RETURN_COMMENT(("xmlParseComment. ctxt = %s;\n", dbgCtxt(ctxt)));
}